

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.cpp
# Opt level: O1

void duckdb::TestDeleteFile(string *path)

{
  char cVar1;
  FileSystem *in_RAX;
  pointer pFVar2;
  pointer *__ptr;
  unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> fs;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  duckdb::FileSystem::CreateLocal();
  pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                       *)&local_18);
  cVar1 = (**(code **)(*(long *)pFVar2 + 0x90))(pFVar2,path,0);
  if (cVar1 != '\0') {
    pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)&local_18);
    (**(code **)(*(long *)pFVar2 + 0xa0))(pFVar2,path,0);
  }
  if (local_18._M_head_impl != (FileSystem *)0x0) {
    (**(code **)(*(long *)local_18._M_head_impl + 8))();
  }
  return;
}

Assistant:

void TestDeleteFile(string path) {
	duckdb::unique_ptr<FileSystem> fs = FileSystem::CreateLocal();
	try {
		if (fs->FileExists(path)) {
			fs->RemoveFile(path);
		}
	} catch (...) {
	}
}